

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
DeselectGenericCommand::trigger(DeselectGenericCommand *this,string_view parameters)

{
  ResponseLine *pRVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ResponseLine *ret;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  DeselectGenericCommand *local_28;
  DeselectGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (DeselectGenericCommand *)parameters._M_len;
  local_28 = this;
  if (IRCCommand::selected_server == 0) {
    pRVar1 = (ResponseLine *)operator_new(0x30);
    local_38 = sv("No IRC server is currently selected.",0x24);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar1,local_38._M_len,local_38._M_str,0);
    parameters_local._M_str = (char *)pRVar1;
  }
  else {
    pRVar1 = (ResponseLine *)operator_new(0x30);
    local_a0 = (basic_string_view<char,_std::char_traits<char>_>)
               Jupiter::IRC::Client::getConfigSection();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_90,&local_a0,&local_a1);
    s_abi_cxx11_(&local_c8," has been deselected.",0x15);
    std::operator+(&local_70,&local_90,&local_c8);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar1,&local_70,0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_a1);
    IRCCommand::selected_server = 0;
    IRCCommand::active_server = 0;
    parameters_local._M_str = (char *)pRVar1;
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DeselectGenericCommand::trigger(std::string_view parameters)
{
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " has been deselected."s, GenericCommand::DisplayType::PublicSuccess);
	IRCCommand::selected_server = nullptr;
	IRCCommand::active_server = IRCCommand::selected_server;
	return ret;
}